

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  long lVar1;
  u8 *puVar2;
  char **ppcVar3;
  Schema *pSVar4;
  sqlite3_vtab *psVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  VtabCtx *pVVar10;
  VTable *pVTab;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  uint uVar16;
  Schema **ppSVar17;
  char *zRight;
  long lVar18;
  char *zErr;
  VtabCtx sCtx;
  uint local_70;
  char *local_58;
  VtabCtx local_50;
  
  ppcVar3 = pTab->azModuleArg;
  iVar9 = pTab->nModuleArg;
  local_58 = (char *)0x0;
  for (pVVar10 = db->pVtabCtx; pVVar10 != (VtabCtx *)0x0; pVVar10 = pVVar10->pPrior) {
    if (pVVar10->pTab == pTab) {
      pcVar12 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar12;
      return 6;
    }
  }
  pcVar12 = sqlite3DbStrDup(db,pTab->zName);
  iVar7 = 7;
  if (pcVar12 != (char *)0x0) {
    pVTab = (VTable *)sqlite3Malloc(0x30);
    if (pVTab == (VTable *)0x0) {
      sqlite3OomFault(db);
      iVar7 = 7;
    }
    else {
      pVTab->db = (sqlite3 *)0x0;
      pVTab->pMod = (Module *)0x0;
      *(undefined8 *)&pVTab->iSavepoint = 0;
      pVTab->pNext = (VTable *)0x0;
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      pVTab->nRef = 0;
      pVTab->bConstraint = '\0';
      *(undefined3 *)&pVTab->field_0x1d = 0;
      pVTab->db = db;
      pVTab->pMod = pMod;
      if (pTab->pSchema == (Schema *)0x0) {
        lVar11 = -1000000;
      }
      else {
        lVar11 = -0x100000000;
        ppSVar17 = &db->aDb->pSchema;
        do {
          lVar11 = lVar11 + 0x100000000;
          pSVar4 = *ppSVar17;
          ppSVar17 = ppSVar17 + 4;
        } while (pSVar4 != pTab->pSchema);
        lVar11 = lVar11 >> 0x20;
      }
      pTab->azModuleArg[1] = db->aDb[lVar11].zDbSName;
      local_50.pPrior = db->pVtabCtx;
      local_50.bDeclared = 0;
      db->pVtabCtx = &local_50;
      local_50.pVTable = pVTab;
      local_50.pTab = pTab;
      iVar7 = (*xConstruct)(db,pMod->pAux,iVar9,ppcVar3,&pVTab->pVtab,&local_58);
      db->pVtabCtx = local_50.pPrior;
      if (iVar7 == 0) {
        psVar5 = pVTab->pVtab;
        iVar7 = 0;
        if (psVar5 != (sqlite3_vtab *)0x0) {
          psVar5->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar5->nRef = 0;
          psVar5->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pVTab->nRef = 1;
          if (local_50.bDeclared == 0) {
            pcVar13 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName)
            ;
            *pzErr = pcVar13;
            sqlite3VtabUnlock(pVTab);
            iVar7 = 1;
          }
          else {
            pVTab->pNext = pTab->pVTable;
            pTab->pVTable = pVTab;
            if (0 < pTab->nCol) {
              lVar11 = 0;
              bVar6 = 0;
              do {
                pcVar13 = "";
                if ((pTab->aCol[lVar11].colFlags & 4) != 0) {
                  pcVar13 = pTab->aCol[lVar11].zName;
                  sVar14 = strlen(pcVar13);
                  pcVar13 = pcVar13 + sVar14 + 1;
                }
                sVar14 = strlen(pcVar13);
                uVar8 = (uint)sVar14;
                local_70 = uVar8 & 0x3fffffff;
                if ((sVar14 & 0x3fffffff) != 0) {
                  lVar18 = 0;
                  zRight = pcVar13;
LAB_0015668b:
                  iVar9 = sqlite3_strnicmp("hidden",zRight,6);
                  if ((iVar9 != 0) ||
                     (((lVar18 != 0 && (zRight[-1] != ' ')) || ((zRight[6] & 0xdfU) != 0))))
                  goto LAB_001566b6;
                  uVar16 = 7 - (zRight[6] == 0);
                  if (uVar16 - (int)lVar18 <= local_70) {
                    lVar15 = -lVar18;
                    do {
                      pcVar13[lVar15] = pcVar13[lVar15 + (ulong)uVar16];
                      lVar1 = (ulong)uVar16 + lVar15;
                      lVar15 = lVar15 + 1;
                    } while (lVar1 + 1U <= (ulong)(uVar8 & 0x3fffffff));
                  }
                  if ((lVar18 != 0) && (*zRight == '\0')) {
                    zRight[-1] = '\0';
                  }
                  puVar2 = &pTab->aCol[lVar11].colFlags;
                  *puVar2 = *puVar2 | 2;
                  bVar6 = 0x80;
                  goto LAB_0015672c;
                }
LAB_001566c1:
                pTab->tabFlags = pTab->tabFlags | (uint)bVar6;
LAB_0015672c:
                lVar11 = lVar11 + 1;
              } while (lVar11 < pTab->nCol);
              iVar7 = 0;
            }
          }
        }
      }
      else {
        if (iVar7 == 7) {
          sqlite3OomFault(db);
        }
        if (local_58 == (char *)0x0) {
          pcVar13 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar12);
          *pzErr = pcVar13;
        }
        else {
          pcVar13 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar13;
          sqlite3_free(local_58);
        }
        sqlite3DbFreeNN(db,pVTab);
      }
    }
    sqlite3DbFreeNN(db,pcVar12);
  }
  return iVar7;
LAB_001566b6:
  lVar18 = lVar18 + -1;
  zRight = zRight + 1;
  if (-lVar18 == (ulong)(uVar8 & 0x3fffffff)) goto LAB_001566c1;
  goto LAB_0015668b;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db, 
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u8 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}